

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di_bind.cpp
# Opt level: O0

void __thiscall anon_class_1_0_00000001::operator()(anon_class_1_0_00000001 *this)

{
  dependency dVar1;
  c_uniform object_2;
  c_inject_conflict object_1;
  c_conflict3 object;
  i injector;
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_i1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  *in_stack_ffffffffffffff78;
  c_uniform *in_stack_ffffffffffffffa0;
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  *in_stack_ffffffffffffffb0;
  
  boost::ext::di::v1_3_0::core::
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  ::operator()((dependency<boost::ext::di::v1_3_0::scopes::deduce,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                *)&boost::ext::di::v1_3_0::bind<int>);
  dVar1 = boost::ext::di::v1_3_0::core::
          dependency<boost::ext::di::v1_3_0::scopes::deduce,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
          ::to<int,_0,_0>((dependency<boost::ext::di::v1_3_0::scopes::deduce,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                           *)in_stack_ffffffffffffff78,(int *)0x11f950);
  boost::ext::di::v1_3_0::core::
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_i1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  ::operator()((dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_i1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
                *)&boost::ext::di::v1_3_0::bind<i1>);
  boost::ext::di::v1_3_0::core::
  dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_i1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  ::to<impl1,_0,_0>(in_stack_ffffffffffffff78);
  boost::ext::di::v1_3_0::
  make_injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_0,_0>
            (dVar1.super_scope<int,_int,_int>.object_);
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  ::create<c,_0>(in_stack_ffffffffffffffb0);
  operator()::c::initialize((c_conflict3 *)in_stack_ffffffffffffffa0);
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  ::create<c_inject,_0>(in_stack_ffffffffffffffb0);
  operator()::c_inject::initialize((c_inject_conflict *)in_stack_ffffffffffffffa0);
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_int,_int,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::deduce,_i1,_impl1,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  ::create<c_uniform,_0>(in_stack_ffffffffffffffb0);
  operator()::c_uniform::initialize(in_stack_ffffffffffffffa0);
  return;
}

Assistant:

c(lazy<int> i1_, const lazy<std::unique_ptr<i1>> &i2_) : i1_(i1_), i2_(i2_) {}